

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

ConstValueRangeAccess * __thiscall
rsg::ConstValueRangeAccess::member
          (ConstValueRangeAccess *__return_storage_ptr__,ConstValueRangeAccess *this,int memberNdx)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  int iVar3;
  
  iVar3 = VariableType::getMemberScalarOffset(this->m_type,memberNdx);
  pSVar1 = this->m_min;
  pSVar2 = this->m_max;
  __return_storage_ptr__->m_type =
       (this->m_type->m_members).
       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
       _M_impl.super__Vector_impl_data._M_start[memberNdx].m_type;
  __return_storage_ptr__->m_min = pSVar1 + iVar3;
  __return_storage_ptr__->m_max = pSVar2 + iVar3;
  return __return_storage_ptr__;
}

Assistant:

inline ConstValueRangeAccess ConstValueRangeAccess::member (int memberNdx) const
{
	int offset = m_type->getMemberScalarOffset(memberNdx);
	return ConstValueRangeAccess(m_type->getMembers()[memberNdx].getType(), m_min + offset, m_max + offset);
}